

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtuiohandler_p.cpp
# Opt level: O0

void QTuioHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  QTuioHandler *in_RDI;
  QOscMessage *unaff_retaddr;
  QTuioHandler *_t;
  QTuioHandler *in_stack_00000028;
  QOscMessage *in_stack_00000030;
  QTuioHandler *in_stack_00000038;
  QTuioHandler *in_stack_00000040;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      processPackets(in_stack_00000028);
      break;
    case 1:
      process2DCurSource(in_RDI,(QOscMessage *)(ulong)in_EDX);
      break;
    case 2:
      process2DCurAlive((QTuioHandler *)CONCAT44(_c,_id),(QOscMessage *)_a);
      break;
    case 3:
      process2DCurSet(_t,unaff_retaddr);
      break;
    case 4:
      process2DCurFseq(in_stack_00000040,(QOscMessage *)in_stack_00000038);
      break;
    case 5:
      process2DObjSource(in_RDI,(QOscMessage *)(ulong)in_EDX);
      break;
    case 6:
      process2DObjAlive((QTuioHandler *)CONCAT44(_c,_id),(QOscMessage *)_a);
      break;
    case 7:
      process2DObjSet((QTuioHandler *)CONCAT44(_c,_id),(QOscMessage *)_a);
      break;
    case 8:
      process2DObjFseq(in_stack_00000038,in_stack_00000030);
    }
  }
  return;
}

Assistant:

void QTuioHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTuioHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->processPackets(); break;
        case 1: _t->process2DCurSource((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 2: _t->process2DCurAlive((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 3: _t->process2DCurSet((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 4: _t->process2DCurFseq((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 5: _t->process2DObjSource((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 6: _t->process2DObjAlive((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 7: _t->process2DObjSet((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 8: _t->process2DObjFseq((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        default: ;
        }
    }
}